

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O2

void __thiscall cmCTestGIT::CommitParser::DoBodyLine(CommitParser *this)

{
  string local_30 [32];
  
  if (3 < (this->super_DiffParser).super_LineParser.Line._M_string_length) {
    std::__cxx11::string::substr
              ((ulong)local_30,(ulong)&(this->super_DiffParser).super_LineParser.Line);
    std::__cxx11::string::append((string *)&(this->Rev).Log);
    std::__cxx11::string::~string(local_30);
  }
  std::__cxx11::string::append((char *)&(this->Rev).Log);
  return;
}

Assistant:

void DoBodyLine()
  {
    // Commit log lines are indented by 4 spaces.
    if (this->Line.size() >= 4) {
      this->Rev.Log += this->Line.substr(4);
    }
    this->Rev.Log += "\n";
  }